

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

UChar32 __thiscall icu_63::RegexCompile::scanNamedChar(RegexCompile *this)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  char16_t *s;
  char local_d8 [4];
  UChar32 theChar;
  char name [100];
  undefined1 local_58 [8];
  UnicodeString charName;
  RegexCompile *this_local;
  
  charName.fUnion._48_8_ = this;
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 != '\0') {
    return 0;
  }
  nextChar(this,&this->fC);
  if ((this->fC).fChar != 0x7b) {
    error(this,U_REGEX_PROPERTY_SYNTAX);
    return 0;
  }
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_58);
  do {
    nextChar(this,&this->fC);
    if ((this->fC).fChar == 0x7d) {
      s = icu_63::UnicodeString::getBuffer((UnicodeString *)local_58);
      iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_58);
      UVar1 = uprv_isInvariantUString_63(s,iVar2);
      if ((UVar1 == '\0') ||
         (uVar3 = icu_63::UnicodeString::length((UnicodeString *)local_58), 99 < uVar3)) {
        error(this,U_REGEX_PROPERTY_SYNTAX);
        this_local._4_4_ = 0;
      }
      else {
        iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_58);
        icu_63::UnicodeString::extract((UnicodeString *)local_58,0,iVar2,local_d8,100,kInvariant);
        this_local._4_4_ = u_charFromName_63(U_UNICODE_CHAR_NAME,local_d8,this->fStatus);
        UVar1 = ::U_FAILURE(*this->fStatus);
        if (UVar1 != '\0') {
          error(this,U_REGEX_PROPERTY_SYNTAX);
        }
        nextChar(this,&this->fC);
      }
LAB_002d2f82:
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_58);
      return this_local._4_4_;
    }
    if ((this->fC).fChar == -1) {
      error(this,U_REGEX_PROPERTY_SYNTAX);
      this_local._4_4_ = 0;
      goto LAB_002d2f82;
    }
    icu_63::UnicodeString::append((UnicodeString *)local_58,(this->fC).fChar);
  } while( true );
}

Assistant:

UChar32  RegexCompile::scanNamedChar() {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }

    nextChar(fC);
    if (fC.fChar != chLBrace) {
        error(U_REGEX_PROPERTY_SYNTAX);
        return 0;
    }

    UnicodeString  charName;
    for (;;) {
        nextChar(fC);
        if (fC.fChar == chRBrace) {
            break;
        }
        if (fC.fChar == -1) {
            error(U_REGEX_PROPERTY_SYNTAX);
            return 0;
        }
        charName.append(fC.fChar);
    }

    char name[100];
    if (!uprv_isInvariantUString(charName.getBuffer(), charName.length()) ||
         (uint32_t)charName.length()>=sizeof(name)) {
        // All Unicode character names have only invariant characters.
        // The API to get a character, given a name, accepts only char *, forcing us to convert,
        //   which requires this error check
        error(U_REGEX_PROPERTY_SYNTAX);
        return 0;
    }
    charName.extract(0, charName.length(), name, sizeof(name), US_INV);

    UChar32  theChar = u_charFromName(U_UNICODE_CHAR_NAME, name, fStatus);
    if (U_FAILURE(*fStatus)) {
        error(U_REGEX_PROPERTY_SYNTAX);
    }

    nextChar(fC);      // Continue overall regex pattern processing with char after the '}'
    return theChar;
}